

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF.h
# Opt level: O2

ChunkHeader Assimp::IFF::LoadChunk(uint8_t **outFile)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  puVar3 = (uint *)*outFile;
  uVar1 = *puVar3;
  *outFile = (uint8_t *)(puVar3 + 1);
  uVar2 = puVar3[1];
  *outFile = (uint8_t *)(puVar3 + 2);
  uVar4 = (ulong)uVar1 << 0x20;
  return (ChunkHeader)
         (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
          (uVar4 & 0xff00000000) >> 8 | ((ulong)uVar2 & 0xff000000) << 8 |
          ((ulong)uVar2 & 0xff0000) << 0x18 | ((ulong)uVar2 & 0xff00) << 0x28 |
         CONCAT44(uVar1,uVar2) << 0x38);
}

Assistant:

inline ChunkHeader LoadChunk(uint8_t*& outFile)
{
    ChunkHeader head;
    ::memcpy(&head.type, outFile, 4);
    outFile += 4;
    ::memcpy(&head.length, outFile, 4);
    outFile += 4;
    AI_LSWAP4(head.length);
    AI_LSWAP4(head.type);
    return head;
}